

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporterUtils.cpp
# Opt level: O3

FrontLoadedReporterDisposer __thiscall
ApprovalTests::CIBuildOnlyReporterUtils::useAsFrontLoadedReporter
          (CIBuildOnlyReporterUtils *this,shared_ptr<ApprovalTests::Reporter> *reporter)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  FrontLoadedReporterDisposer FVar2;
  undefined1 local_39;
  CIBuildOnlyReporter *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<ApprovalTests::Reporter> local_28;
  
  local_38 = (CIBuildOnlyReporter *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ApprovalTests::CIBuildOnlyReporter,std::allocator<ApprovalTests::CIBuildOnlyReporter>,std::shared_ptr<ApprovalTests::Reporter>const&>
            (&_Stack_30,&local_38,(allocator<ApprovalTests::CIBuildOnlyReporter> *)&local_39,
             reporter);
  local_28.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_Reporter;
  local_28.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_30._M_pi;
  local_38 = (CIBuildOnlyReporter *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  FrontLoadedReporterDisposer::FrontLoadedReporterDisposer
            ((FrontLoadedReporterDisposer *)this,&local_28);
  _Var1._M_pi = extraout_RDX;
  if (local_28.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  FVar2.previous_result.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  FVar2.previous_result.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (FrontLoadedReporterDisposer)
         FVar2.previous_result.
         super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FrontLoadedReporterDisposer CIBuildOnlyReporterUtils::useAsFrontLoadedReporter(
        const std::shared_ptr<Reporter>& reporter)
    {
        return Approvals::useAsFrontLoadedReporter(
            std::make_shared<ApprovalTests::CIBuildOnlyReporter>(reporter));
    }